

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMulti.c
# Opt level: O3

Abc_Obj_t * Abc_NtkMulti_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld)

{
  byte *pbVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  DdManager *dd;
  void *pvVar4;
  uint uVar5;
  Vec_Ptr_t *vCone;
  void **ppvVar6;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin;
  DdNode *pDVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (((ulong)pNodeOld & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb5,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  if ((Abc_Obj_t *)(pNodeOld->field_6).pTemp != (Abc_Obj_t *)0x0) {
    return (Abc_Obj_t *)(pNodeOld->field_6).pTemp;
  }
  if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                  ,0xb9,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
  }
  pAVar3 = pNodeOld->pNtk;
  if (pAVar3->ntkType == ABC_NTK_STRASH) {
    if ((*(uint *)&pNodeOld->field_0x14 & 0x10) == 0) {
      __assert_fail("pNodeOld->fMarkA",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xbb,"Abc_Obj_t *Abc_NtkMulti_rec(Abc_Ntk_t *, Abc_Obj_t *)");
    }
    vCone = (Vec_Ptr_t *)malloc(0x10);
    vCone->nCap = 10;
    ppvVar6 = (void **)malloc(0x50);
    vCone->pArray = ppvVar6;
    vCone->nSize = 0;
    Abc_NtkMultiCone_rec((Abc_Obj_t *)pAVar3->vObjs->pArray[*(pNodeOld->vFanins).pArray],vCone);
    Abc_NtkMultiCone_rec
              ((Abc_Obj_t *)pNodeOld->pNtk->vObjs->pArray[(pNodeOld->vFanins).pArray[1]],vCone);
    pObj = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
    iVar2 = vCone->nSize;
    uVar9 = (ulong)iVar2;
    if (0 < (long)uVar9) {
      ppvVar6 = vCone->pArray;
      uVar10 = 0;
      do {
        pFanin = Abc_NtkMulti_rec(pNtkNew,(Abc_Obj_t *)ppvVar6[uVar10]);
        Abc_ObjAddFanin(pObj,pFanin);
        uVar10 = uVar10 + 1;
      } while (uVar10 < uVar9);
    }
    if (pNodeOld->pNtk->ntkType == ABC_NTK_STRASH) {
      uVar5 = *(uint *)&pNodeOld->field_0x14 & 0xf;
      if (uVar5 == 7) {
        dd = (DdManager *)pNtkNew->pManFunc;
        if (0 < iVar2) {
          ppvVar6 = vCone->pArray;
          uVar10 = 0;
          do {
            pvVar4 = ppvVar6[uVar10];
            pDVar7 = Cudd_bddIthVar(dd,(int)uVar10);
            *(DdNode **)((long)pvVar4 + 0x38) = pDVar7;
            Cudd_Ref(pDVar7);
            pbVar1 = (byte *)((long)pvVar4 + 0x14);
            *pbVar1 = *pbVar1 | 0x40;
            uVar10 = uVar10 + 1;
          } while (uVar10 < uVar9);
        }
        pDVar7 = Abc_NtkMultiDeriveBdd_rec(dd,pNodeOld,vCone);
        Cudd_Ref(pDVar7);
        if (0 < vCone->nSize) {
          lVar8 = 0;
          do {
            pvVar4 = vCone->pArray[lVar8];
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x38));
            pbVar1 = (byte *)((long)pvVar4 + 0x14);
            *pbVar1 = *pbVar1 & 0xbf;
            lVar8 = lVar8 + 1;
          } while (lVar8 < vCone->nSize);
        }
        Cudd_Deref(pDVar7);
        (pObj->field_5).pData = pDVar7;
        Cudd_Ref(pDVar7);
        if (vCone->pArray != (void **)0x0) {
          free(vCone->pArray);
        }
        free(vCone);
        (pNodeOld->field_6).pCopy = pObj;
        return pObj;
      }
      if (uVar5 != 1) {
        __assert_fail("Abc_ObjIsNode(pNodeOld)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                      ,0xe4,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
      }
      __assert_fail("!Abc_AigNodeIsConst(pNodeOld)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMulti.c"
                    ,0xe3,"DdNode *Abc_NtkMultiDeriveBdd(DdManager *, Abc_Obj_t *, Vec_Ptr_t *)");
    }
  }
  __assert_fail("Abc_NtkIsStrash(Abc_ObjRegular(pNode)->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abc.h"
                ,0x18e,"int Abc_AigNodeIsConst(Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_NtkMulti_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld )
{
    Vec_Ptr_t * vCone;
    Abc_Obj_t * pNodeNew;
    int i;

    assert( !Abc_ObjIsComplement(pNodeOld) );
    // return if the result if known
    if ( pNodeOld->pCopy )
        return pNodeOld->pCopy;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( !Abc_AigNodeIsConst(pNodeOld) );
    assert( pNodeOld->fMarkA );

//printf( "%d ", Abc_NodeMffcSizeSupp(pNodeOld) );

    // collect the renoding cone
    vCone = Vec_PtrAlloc( 10 );
    Abc_NtkMultiCone( pNodeOld, vCone );

    // create a new node 
    pNodeNew = Abc_NtkCreateNode( pNtkNew ); 
    for ( i = 0; i < vCone->nSize; i++ )
        Abc_ObjAddFanin( pNodeNew, Abc_NtkMulti_rec(pNtkNew, (Abc_Obj_t *)vCone->pArray[i]) );

    // derive the function of this node
    pNodeNew->pData = Abc_NtkMultiDeriveBdd( (DdManager *)pNtkNew->pManFunc, pNodeOld, vCone );    
    Cudd_Ref( (DdNode *)pNodeNew->pData );
    Vec_PtrFree( vCone );

    // remember the node
    pNodeOld->pCopy = pNodeNew;
    return pNodeOld->pCopy;
}